

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

void printReads(ostream *outfile,deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *reads
               ,int doc_haplotypes)

{
  int iVar1;
  pointer pbVar2;
  _Elt_pointer ppAVar3;
  ulong uVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  pointer pbVar6;
  _Elt_pointer ppAVar7;
  pointer pbVar8;
  pointer pbVar9;
  AlignmentRecord *pAVar10;
  char *pcVar11;
  bool bVar12;
  pointer pbVar13;
  int iVar14;
  int iVar15;
  _Map_pointer pppAVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  AlignmentRecord **r;
  _Elt_pointer ppAVar22;
  _Elt_pointer local_118;
  _Map_pointer local_110;
  _Map_pointer local_108;
  pointer local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  _Map_pointer local_e0;
  _Map_pointer local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  _Map_pointer local_b0;
  pointer local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  _Map_pointer local_80;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  _Map_pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  _Map_pointer local_38;
  
  pbVar6 = (pointer)(reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>
                    )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar8 = (pointer)(reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>
                    )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar6 == pbVar8) goto LAB_00173cff;
  pbVar13 = (pointer)(reads->
                     super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                     _M_impl.super__Deque_impl_data._M_start._M_first;
  pbVar9 = (pointer)(reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>
                    )._M_impl.super__Deque_impl_data._M_start._M_last;
  pppAVar16 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
              _M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar2 = (pointer)(reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>
                    )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_a0 = (pointer)(reads->
                      super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_last;
  local_d0 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_node;
  uVar20 = ((long)pbVar9 - (long)pbVar6 >> 3) + ((long)pbVar8 - (long)pbVar2 >> 3) +
           ((((ulong)((long)local_d0 - (long)pppAVar16) >> 3) - 1) +
           (ulong)(local_d0 == (_Map_pointer)0x0)) * 0x40;
  lVar21 = 0x3f;
  if (uVar20 != 0) {
    for (; uVar20 >> lVar21 == 0; lVar21 = lVar21 + -1) {
    }
  }
  local_70 = pbVar8;
  local_68 = pbVar2;
  local_60 = local_a0;
  local_58 = local_d0;
  local_50 = pbVar6;
  local_48 = pbVar13;
  local_40 = pbVar9;
  local_38 = pppAVar16;
  std::
  __introsort_loop<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,long,__gnu_cxx::__ops::_Iter_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
            (&local_50,&local_70,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
  if ((long)uVar20 < 0x11) {
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_a0;
    local_e0 = local_d0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar8;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar6;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar13;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar9;
    local_80 = pppAVar16;
    std::
    __insertion_sort<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,__gnu_cxx::__ops::_Iter_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
              ();
    goto LAB_00173cff;
  }
  lVar21 = (long)pbVar6 - (long)pbVar13 >> 3;
  uVar20 = lVar21 + 0x10;
  uVar5 = (long)uVar20 >> 6;
  uVar4 = uVar5;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar6;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar13;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar9;
  local_e0 = pppAVar16;
  if (lVar21 < -0x10) {
LAB_00173c06:
    local_b0 = pppAVar16 + uVar4;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)*local_b0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_c8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 0x10;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(&local_c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[uVar4 * -0x10 + 4]._M_dataplus +
                  lVar21);
    std::
    __insertion_sort<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,__gnu_cxx::__ops::_Iter_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
              (&local_f8);
    if (-0x11 < lVar21) {
      if (uVar20 < 0x40) goto LAB_00173c61;
      uVar5 = uVar20 >> 6;
    }
    pppAVar16 = pppAVar16 + uVar5;
    pbVar13 = (pointer)*pppAVar16;
    pbVar9 = pbVar13 + 0x10;
    pbVar6 = (pointer)(&pbVar13[uVar5 * -0x10 + 4]._M_dataplus + lVar21);
  }
  else {
    if (0x3f < uVar20) {
      uVar4 = uVar20 >> 6;
      goto LAB_00173c06;
    }
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar6 + 4;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar13;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar9;
    local_b0 = pppAVar16;
    std::
    __insertion_sort<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,__gnu_cxx::__ops::_Iter_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
              (&local_f8);
LAB_00173c61:
    pbVar6 = pbVar6 + 4;
  }
  if (pbVar6 != pbVar8) {
    do {
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar6;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar13;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar9;
      local_80 = pppAVar16;
      std::
      __unguarded_linear_insert<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,__gnu_cxx::__ops::_Val_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
                (&local_98);
      pbVar6 = (pointer)&pbVar6->_M_string_length;
      if (pbVar6 == pbVar9) {
        pbVar6 = (pointer)pppAVar16[1];
        pppAVar16 = pppAVar16 + 1;
        pbVar9 = pbVar6 + 0x10;
        pbVar13 = pbVar6;
      }
    } while (pbVar6 != pbVar8);
  }
LAB_00173cff:
  lVar21 = *(long *)outfile;
  *(undefined8 *)(outfile + *(long *)(lVar21 + -0x18) + 8) = 5;
  lVar21 = *(long *)(lVar21 + -0x18);
  *(uint *)(outfile + lVar21 + 0x18) = *(uint *)(outfile + lVar21 + 0x18) & 0xfffffefb | 4;
  bVar12 = SUB81(outfile,0);
  if (doc_haplotypes == 5) {
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pbVar6 = (pointer)(reads->
                      super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_a0 = (pointer)(reads->
                        super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                        _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pbVar6 != local_a0) {
      local_100 = (pointer)(reads->
                           super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>)
                           ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_d0 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        AlignmentRecord::getReadNames_abi_cxx11_
                  (&local_c8,(AlignmentRecord *)(pbVar6->_M_dataplus)._M_p);
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,">",1);
        pAVar10 = (AlignmentRecord *)(pbVar6->_M_dataplus)._M_p;
        std::__ostream_insert<char,std::char_traits<char>>
                  (outfile,(pAVar10->name)._M_dataplus._M_p,(pAVar10->name)._M_string_length);
        pAVar10 = (AlignmentRecord *)(pbVar6->_M_dataplus)._M_p;
        if (pAVar10->single_end == true) {
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
          std::ostream::_M_insert<double>
                    (((AlignmentRecord *)(pbVar6->_M_dataplus)._M_p)->probability);
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
          std::ostream::_M_insert<unsigned_long>((ulong)outfile);
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|end1:",6);
LAB_001745f5:
          std::ostream::_M_insert<unsigned_long>((ulong)outfile);
        }
        else {
          uVar17 = pAVar10->end1 + 1;
          if (uVar17 < pAVar10->start2) {
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|paired",7);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
            std::ostream::_M_insert<double>
                      (((AlignmentRecord *)(pbVar6->_M_dataplus)._M_p)->probability);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|end1:",6);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start2:",8);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            pcVar11 = "|end2:";
LAB_001745e2:
            std::__ostream_insert<char,std::char_traits<char>>(outfile,pcVar11,6);
            goto LAB_001745f5;
          }
          if (uVar17 == pAVar10->start2) {
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
            std::ostream::_M_insert<double>
                      (((AlignmentRecord *)(pbVar6->_M_dataplus)._M_p)->probability);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            pcVar11 = "|end1:";
            goto LAB_001745e2;
          }
        }
        pbVar8 = local_f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar14 = 0;
          iVar18 = 0;
          iVar1 = 0;
          iVar19 = 0;
          iVar15 = 0;
        }
        else {
          iVar15 = 0;
          iVar19 = 0;
          iVar1 = 0;
          iVar18 = 0;
          iVar14 = 0;
          pbVar9 = local_f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            lVar21 = std::__cxx11::string::find((char *)pbVar9,0x19a539,0);
            if (lVar21 == -1) {
              lVar21 = std::__cxx11::string::find((char *)pbVar9,0x19a541,0);
              if (lVar21 == -1) {
                lVar21 = std::__cxx11::string::find((char *)pbVar9,0x19a549,0);
                if (lVar21 == -1) {
                  lVar21 = std::__cxx11::string::find((char *)pbVar9,0x19a551,0);
                  if (lVar21 == -1) {
                    lVar21 = std::__cxx11::string::find((char *)pbVar9,0x19a559,0);
                    iVar1 = iVar1 + (uint)(lVar21 != -1);
                  }
                  else {
                    iVar18 = iVar18 + 1;
                  }
                }
                else {
                  iVar14 = iVar14 + 1;
                }
              }
              else {
                iVar19 = iVar19 + 1;
              }
            }
            else {
              iVar15 = iVar15 + 1;
            }
            pbVar9 = pbVar9 + 1;
          } while (pbVar9 != pbVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht1:",5);
        std::ostream::operator<<((ostream *)outfile,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht2:",5);
        std::ostream::operator<<((ostream *)outfile,iVar19);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht3:",5);
        std::ostream::operator<<((ostream *)outfile,iVar14);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht4:",5);
        std::ostream::operator<<((ostream *)outfile,iVar18);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht5:",5);
        std::ostream::operator<<((ostream *)outfile,iVar1);
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + bVar12);
        std::ostream::put(bVar12);
        std::ostream::flush();
        operator<<(outfile,&((AlignmentRecord *)(pbVar6->_M_dataplus)._M_p)->sequence1);
        pAVar10 = (AlignmentRecord *)(pbVar6->_M_dataplus)._M_p;
        if (pAVar10->single_end == false) {
          uVar17 = pAVar10->end1;
          while( true ) {
            uVar17 = uVar17 + 1;
            pAVar10 = (AlignmentRecord *)(pbVar6->_M_dataplus)._M_p;
            if (pAVar10->start2 <= uVar17) break;
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"N",1);
          }
          operator<<(outfile,&pAVar10->sequence2);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + bVar12);
        std::ostream::put(bVar12);
        std::ostream::flush();
        pbVar6 = (pointer)&pbVar6->_M_string_length;
        if (pbVar6 == local_100) {
          pbVar6 = (pointer)local_d0[1];
          local_d0 = local_d0 + 1;
          local_100 = pbVar6 + 0x10;
        }
      } while (pbVar6 != local_a0);
    }
  }
  else {
    if (doc_haplotypes != 2) {
      if (doc_haplotypes != 0) {
        return;
      }
      ppAVar22 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
      ppAVar3 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppAVar22 == ppAVar3) {
        return;
      }
      ppAVar7 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
      local_110 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        AlignmentRecord::getReadNames_abi_cxx11_(&local_98,*ppAVar22);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_98);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,">",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (outfile,((*ppAVar22)->name)._M_dataplus._M_p,((*ppAVar22)->name)._M_string_length
                  );
        if ((*ppAVar22)->single_end == false) {
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|paired",7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
        std::ostream::_M_insert<double>((*ppAVar22)->probability);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
        std::ostream::_M_insert<unsigned_long>((ulong)outfile);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|end1:",6);
        std::ostream::_M_insert<unsigned_long>((ulong)outfile);
        if ((*ppAVar22)->single_end == false) {
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start2:",8);
          std::ostream::_M_insert<unsigned_long>((ulong)outfile);
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|end2:",6);
          std::ostream::_M_insert<unsigned_long>((ulong)outfile);
        }
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|#reads:",8);
        std::ostream::_M_insert<unsigned_long>((ulong)outfile);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|#strand:",9);
        std::ostream::_M_insert<bool>(bVar12);
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + bVar12);
        std::ostream::put(bVar12);
        std::ostream::flush();
        operator<<(outfile,&(*ppAVar22)->sequence1);
        pAVar10 = *ppAVar22;
        if (pAVar10->single_end == false) {
          uVar17 = pAVar10->end1;
          while (uVar17 = uVar17 + 1, uVar17 < pAVar10->start2) {
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"N",1);
            pAVar10 = *ppAVar22;
          }
          operator<<(outfile,&pAVar10->sequence2);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + bVar12);
        std::ostream::put(bVar12);
        std::ostream::flush();
        ppAVar22 = ppAVar22 + 1;
        if (ppAVar22 == ppAVar7) {
          ppAVar22 = local_110[1];
          local_110 = local_110 + 1;
          ppAVar7 = ppAVar22 + 0x40;
        }
      } while (ppAVar22 != ppAVar3);
      return;
    }
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppAVar22 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppAVar3 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppAVar22 != ppAVar3) {
      local_118 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_last;
      local_108 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        AlignmentRecord::getReadNames_abi_cxx11_(&local_c8,*ppAVar22);
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,">",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (outfile,((*ppAVar22)->name)._M_dataplus._M_p,((*ppAVar22)->name)._M_string_length
                  );
        pAVar10 = *ppAVar22;
        if (pAVar10->single_end == true) {
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
          std::ostream::_M_insert<double>((*ppAVar22)->probability);
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
          std::ostream::_M_insert<unsigned_long>((ulong)outfile);
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|end1:",6);
LAB_0017420b:
          std::ostream::_M_insert<unsigned_long>((ulong)outfile);
        }
        else {
          uVar17 = pAVar10->end1 + 1;
          if (uVar17 < pAVar10->start2) {
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|paired",7);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
            std::ostream::_M_insert<double>((*ppAVar22)->probability);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|end1:",6);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start2:",8);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            pcVar11 = "|end2:";
LAB_001741f8:
            std::__ostream_insert<char,std::char_traits<char>>(outfile,pcVar11,6);
            goto LAB_0017420b;
          }
          if (uVar17 == pAVar10->start2) {
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
            std::ostream::_M_insert<double>((*ppAVar22)->probability);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            pcVar11 = "|end1:";
            goto LAB_001741f8;
          }
        }
        pbVar6 = local_f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar18 = 0;
          iVar14 = 0;
        }
        else {
          iVar14 = 0;
          iVar18 = 0;
          pbVar8 = local_f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            lVar21 = std::__cxx11::string::find((char *)pbVar8,0x19a57f,0);
            if (lVar21 == -1) {
              lVar21 = std::__cxx11::string::find((char *)pbVar8,0x19a586,0);
              iVar14 = iVar14 + (uint)(lVar21 != -1);
            }
            else {
              iVar18 = iVar18 + 1;
            }
            pbVar8 = pbVar8 + 1;
          } while (pbVar8 != pbVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht1:",5);
        std::ostream::operator<<((ostream *)outfile,iVar18);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht2:",5);
        std::ostream::operator<<((ostream *)outfile,iVar14);
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + bVar12);
        std::ostream::put(bVar12);
        std::ostream::flush();
        operator<<(outfile,&(*ppAVar22)->sequence1);
        if ((*ppAVar22)->single_end == false) {
          uVar17 = (*ppAVar22)->end1;
          while( true ) {
            uVar17 = uVar17 + 1;
            if ((*ppAVar22)->start2 <= uVar17) break;
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"N",1);
          }
          operator<<(outfile,&(*ppAVar22)->sequence2);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + bVar12);
        std::ostream::put(bVar12);
        std::ostream::flush();
        ppAVar22 = ppAVar22 + 1;
        if (ppAVar22 == local_118) {
          ppAVar22 = local_108[1];
          local_108 = local_108 + 1;
          local_118 = ppAVar22 + 0x40;
        }
      } while (ppAVar22 != ppAVar3);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return;
}

Assistant:

void printReads(std::ostream& outfile, std::deque<AlignmentRecord*>& reads, int doc_haplotypes) {
    auto comp = [](AlignmentRecord* al1, AlignmentRecord* al2) { return al1->probability > al2->probability; };
    std::sort(reads.begin(), reads.end(), comp);

    outfile.precision(5);
    outfile << std::fixed;


    if (doc_haplotypes == 0){
        for (auto&& r : reads) {
            unsigned int abs_number_reads = r->getReadNames().size();
            outfile << ">" <<r->name;
            if (not r->single_end) outfile << "|paired";
            outfile << "|ht_freq:" << r->probability;
            outfile << "|start1:" << r->getStart1();
            outfile << "|end1:" << r->getEnd1();
            if (not r->single_end){
                outfile << "|start2:" << r->getStart2();
                outfile << "|end2:" << r->getEnd2();
            }
            outfile << "|#reads:" << abs_number_reads;
            outfile << "|#strand:" << r->isStrand1();
            outfile << endl;

            outfile << r->sequence1;
            if (not r->single_end) {
                for(unsigned int i = r->end1+1; i < r->start2; i++) {
                    outfile << "N";
                }
                outfile << r->sequence2;
            }
            outfile << endl;
        }
    } else if(doc_haplotypes == 5) {
        std::vector<std::string> names;
        for (auto&& r : reads) {
            names = r->getReadNames();
            int haplo1counter = 0;
            int haplo2counter = 0;
            int haplo3counter = 0;
            int haplo4counter = 0;
            int haplo5counter = 0;
            outfile << ">" << r->name;

            if(r->single_end){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
            }
            else if(!r->single_end && (r->getEnd1()+1 < r->getStart2())){
                outfile << "|paired";
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
                outfile << "|start2:" << r->getStart2();
                outfile << "|end2:" << r->getEnd2();
            }
            else if (!r->single_end && (r->getEnd1()+1 == r->getStart2())){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd2();
            }
            for(auto& i: names){
                 if (i.find("mutant1") != std::string::npos){
                    haplo1counter++;
                 } else if (i.find("mutant2") != std::string::npos) {
                    haplo2counter++;
                 } else if (i.find("mutant3") != std::string::npos) {
                    haplo3counter++;
                 } else if (i.find("mutant4") != std::string::npos) {
                    haplo4counter++;
                 } else if (i.find("mutant5") != std::string::npos) {
                    haplo5counter++;
                 }
            }
            outfile << "|ht1:" << haplo1counter;
            outfile << "|ht2:" << haplo2counter;
            outfile << "|ht3:" << haplo3counter;
            outfile << "|ht4:" << haplo4counter;
            outfile << "|ht5:" << haplo5counter;
            outfile << endl;

            outfile << r->sequence1;

            if (not r->single_end) {
                for(unsigned int i = r->end1+1; i < r->start2; i++) {
                    outfile << "N";
                }
                outfile << r->sequence2;
            }
            outfile << endl;
        }
    } else if(doc_haplotypes == 2){
        std::vector<std::string> names;
        for (auto&& r : reads) {
            names = r->getReadNames();
            int haplo1counter = 0;
            int haplo2counter = 0;
            outfile << ">" << r->name;

            if(r->single_end){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
            }
            else if(!r->single_end && (r->getEnd1()+1 < r->getStart2())){
                outfile << "|paired";
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
                outfile << "|start2:" << r->getStart2();
                outfile << "|end2:" << r->getEnd2();
            }
            else if (!r->single_end && (r->getEnd1()+1 == r->getStart2())){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd2();
            }
            for(auto& i: names){
                 if (i.find("normal") != std::string::npos){
                    haplo1counter++;
                 } else if (i.find("mutant") != std::string::npos) {
                    haplo2counter++;
                 }
            }
            outfile << "|ht1:" << haplo1counter;
            outfile << "|ht2:" << haplo2counter;
            outfile << endl;

            outfile << r->sequence1;

            if (not r->single_end) {
                for(unsigned int i = r->end1+1; i < r->start2; i++) {
                    outfile << "N";
                }
                outfile << r->sequence2;
            }
            outfile << endl;
        }
    }
}